

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O2

void __thiscall aiCamera::GetCameraMatrix(aiCamera *this,aiMatrix4x4 *out)

{
  float fVar1;
  float fVar2;
  float fVar3;
  aiVector3t<float> aVar4;
  aiVector3D yaxis;
  aiVector3D zaxis;
  aiVector3t<float> local_60;
  aiVector3t<float> local_50;
  aiVector3t<float> local_40;
  
  local_40.z = (this->mLookAt).z;
  local_40.x = (this->mLookAt).x;
  local_40.y = (this->mLookAt).y;
  aiVector3t<float>::Normalize(&local_40);
  local_50.z = (this->mUp).z;
  local_50.x = (this->mUp).x;
  local_50.y = (this->mUp).y;
  aiVector3t<float>::Normalize(&local_50);
  aVar4 = operator^(&this->mUp,&this->mLookAt);
  local_60.z = aVar4.z;
  local_60._0_8_ = aVar4._0_8_;
  aiVector3t<float>::Normalize(&local_60);
  out->a4 = -((this->mPosition).z * local_60.z +
             (this->mPosition).x * local_60.x + local_60.y * (this->mPosition).y);
  out->b4 = -((this->mPosition).z * local_50.z +
             (this->mPosition).x * local_50.x + local_50.y * (this->mPosition).y);
  fVar1 = (this->mPosition).x;
  fVar2 = (this->mPosition).y;
  fVar3 = (this->mPosition).z;
  out->a1 = local_60.x;
  out->a2 = local_60.y;
  out->a3 = local_60.z;
  out->b1 = local_50.x;
  out->b2 = local_50.y;
  out->b3 = local_50.z;
  out->c4 = -(fVar1 * local_40.x + local_40.y * fVar2 + fVar3 * local_40.z);
  out->c1 = local_40.x;
  out->c2 = local_40.y;
  out->c3 = local_40.z;
  out->d1 = 0.0;
  out->d2 = 0.0;
  out->d3 = 0.0;
  out->d4 = 1.0;
  return;
}

Assistant:

void GetCameraMatrix (aiMatrix4x4& out) const
    {
        /** todo: test ... should work, but i'm not absolutely sure */

        /** We don't know whether these vectors are already normalized ...*/
        aiVector3D zaxis = mLookAt;     zaxis.Normalize();
        aiVector3D yaxis = mUp;         yaxis.Normalize();
        aiVector3D xaxis = mUp^mLookAt; xaxis.Normalize();

        out.a4 = -(xaxis * mPosition);
        out.b4 = -(yaxis * mPosition);
        out.c4 = -(zaxis * mPosition);

        out.a1 = xaxis.x;
        out.a2 = xaxis.y;
        out.a3 = xaxis.z;

        out.b1 = yaxis.x;
        out.b2 = yaxis.y;
        out.b3 = yaxis.z;

        out.c1 = zaxis.x;
        out.c2 = zaxis.y;
        out.c3 = zaxis.z;

        out.d1 = out.d2 = out.d3 = 0.f;
        out.d4 = 1.f;
    }